

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::GeometryShaderRenderTest::iterate
          (GeometryShaderRenderTest *this)

{
  uint uVar1;
  TestLog *pTVar2;
  uint uVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  undefined4 uVar7;
  RenderTarget *pRVar8;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  int iVar9;
  size_t __n;
  Surface *pSVar10;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  int iVar11;
  int dy;
  int iVar12;
  allocator<char> local_448;
  allocator<char> local_447;
  allocator<char> local_446;
  allocator<char> local_445;
  allocator<char> local_444;
  allocator<char> local_443;
  allocator<char> local_442;
  allocator<char> local_441;
  uint local_440;
  int local_43c;
  RGBA testColor;
  RGBA refcolor;
  Surface errorMask;
  LogImageSet local_3d0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  LogImage local_2d0;
  LogImage local_240;
  IVec4 colDiff;
  
  iVar12 = this->m_interationCount;
  __n = (size_t)(iVar12 + 1U);
  this->m_interationCount = iVar12 + 1U;
  if (iVar12 == 1) {
    iVar12 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(this);
    renderWithContext(this,this->m_glContext,(ShaderProgram *)CONCAT44(extraout_var,iVar12),
                      this->m_glResult);
    renderWithContext(this,&this->m_refContext->super_Context,
                      (ShaderProgram *)CONCAT44(extraout_var,iVar12),this->m_refResult);
  }
  else {
    if (iVar12 != 0) {
      pRVar8 = Context::getRenderTarget((this->super_TestCase).m_context);
      if (pRVar8->m_numSamples < 2) {
        tcu::Surface::Surface
                  (&errorMask,(this->m_viewportSize).m_data[0],(this->m_viewportSize).m_data[1]);
        bVar5 = true;
        iVar12 = 0;
        while (iVar11 = iVar12, iVar11 < (this->m_viewportSize).m_data[0]) {
          uVar3 = 0;
          iVar12 = iVar11 + 1;
          while( true ) {
            uVar1 = (this->m_viewportSize).m_data[1];
            __n = (size_t)uVar1;
            if ((int)uVar1 <= (int)uVar3) break;
            if ((iVar11 == 0 || uVar3 == 0) ||
               (uVar3 + 1 == uVar1 || iVar12 == (this->m_viewportSize).m_data[0])) {
              *(undefined4 *)
               ((long)errorMask.m_pixels.m_ptr + (long)(int)(uVar3 * errorMask.m_width + iVar11) * 4
               ) = 0xff00ff00;
              uVar3 = uVar3 + 1;
            }
            else {
              refcolor.m_value =
                   *(deUint32 *)
                    ((long)(this->m_refResult->m_pixels).m_ptr +
                    (long)(int)(this->m_refResult->m_width * uVar3 + iVar11) * 4);
              bVar4 = false;
              local_440 = uVar3 + 1;
              local_43c = iVar12;
              for (iVar6 = -1; iVar6 != 2; iVar6 = iVar6 + 1) {
                for (iVar12 = -1; iVar12 != 2; iVar12 = iVar12 + 1) {
                  testColor.m_value =
                       *(deUint32 *)
                        ((long)(this->m_glResult->m_pixels).m_ptr +
                        (long)(int)((uVar3 + iVar12) * this->m_glResult->m_width + iVar6 + iVar11) *
                        4);
                  tcu::RGBA::toIVec((RGBA *)&local_2d0);
                  tcu::RGBA::toIVec((RGBA *)&local_3d0);
                  tcu::operator-((tcu *)&local_240,(Vector<int,_4> *)&local_2d0,
                                 (Vector<int,_4> *)&local_3d0);
                  tcu::abs<int,4>((tcu *)&colDiff,(Vector<int,_4> *)&local_240);
                  iVar9 = colDiff.m_data[1];
                  if (colDiff.m_data[1] < colDiff.m_data[0]) {
                    iVar9 = colDiff.m_data[0];
                  }
                  if (iVar9 <= colDiff.m_data[2]) {
                    iVar9 = colDiff.m_data[2];
                  }
                  bVar4 = (bool)(bVar4 | iVar9 < 0x15);
                }
              }
              bVar5 = (bool)(bVar5 & bVar4);
              uVar7 = 0xff0000ff;
              if (bVar4) {
                uVar7 = 0xff00ff00;
              }
              *(undefined4 *)
               ((long)errorMask.m_pixels.m_ptr + (long)(int)(uVar3 * errorMask.m_width + iVar11) * 4
               ) = uVar7;
              uVar3 = local_440;
              iVar12 = local_43c;
            }
          }
        }
        pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        iVar12 = (int)pTVar2;
        if (bVar5) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2d0,"Compare result",(allocator<char> *)&local_390);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3d0,"Result of rendering",(allocator<char> *)&local_330);
          tcu::LogImageSet::LogImageSet
                    ((LogImageSet *)&local_240,&local_2d0.m_name,&local_3d0.m_name);
          tcu::LogImageSet::write((LogImageSet *)&local_240,iVar12,__buf,__n);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&refcolor,"Result",(allocator<char> *)&local_350);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&testColor,"Result",(allocator<char> *)&local_370);
          pSVar10 = this->m_glResult;
          tcu::LogImage::LogImage
                    ((LogImage *)&colDiff,(string *)&refcolor,(string *)&testColor,pSVar10,
                     QP_IMAGE_COMPRESSION_MODE_BEST);
          tcu::LogImage::write((LogImage *)&colDiff,iVar12,__buf_00,(size_t)pSVar10);
          tcu::TestLog::endImageSet(pTVar2);
          tcu::LogImage::~LogImage((LogImage *)&colDiff);
          std::__cxx11::string::~string((string *)&testColor);
          std::__cxx11::string::~string((string *)&refcolor);
          tcu::LogImageSet::~LogImageSet((LogImageSet *)&local_240);
          std::__cxx11::string::~string((string *)&local_3d0);
          std::__cxx11::string::~string((string *)&local_2d0);
          colDiff.m_data._0_8_ =
               ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)(colDiff.m_data + 2));
          std::operator<<((ostream *)(colDiff.m_data + 2),"Image compare ok.");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&colDiff,(EndMessageToken *)&tcu::TestLog::EndMessage);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&refcolor,"Compare result",&local_441);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&testColor,"Result of rendering",&local_442);
          tcu::LogImageSet::LogImageSet(&local_3d0,(string *)&refcolor,(string *)&testColor);
          tcu::LogImageSet::write(&local_3d0,iVar12,__buf_01,__n);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_390,"Result",&local_443);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_330,"Result",&local_444);
          pSVar10 = this->m_glResult;
          tcu::LogImage::LogImage
                    ((LogImage *)&colDiff,&local_390,&local_330,pSVar10,
                     QP_IMAGE_COMPRESSION_MODE_BEST);
          tcu::LogImage::write((LogImage *)&colDiff,iVar12,__buf_02,(size_t)pSVar10);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_350,"Reference",&local_445);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_370,"Reference",&local_446);
          pSVar10 = this->m_refResult;
          tcu::LogImage::LogImage
                    (&local_240,&local_350,&local_370,pSVar10,QP_IMAGE_COMPRESSION_MODE_BEST);
          tcu::LogImage::write(&local_240,iVar12,__buf_03,(size_t)pSVar10);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2f0,"ErrorMask",&local_447);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_310,"Error mask",&local_448);
          pSVar10 = &errorMask;
          tcu::LogImage::LogImage
                    (&local_2d0,&local_2f0,&local_310,pSVar10,QP_IMAGE_COMPRESSION_MODE_BEST);
          tcu::LogImage::write(&local_2d0,iVar12,__buf_04,(size_t)pSVar10);
          tcu::TestLog::endImageSet(pTVar2);
          tcu::LogImage::~LogImage(&local_2d0);
          std::__cxx11::string::~string((string *)&local_310);
          std::__cxx11::string::~string((string *)&local_2f0);
          tcu::LogImage::~LogImage(&local_240);
          std::__cxx11::string::~string((string *)&local_370);
          std::__cxx11::string::~string((string *)&local_350);
          tcu::LogImage::~LogImage((LogImage *)&colDiff);
          std::__cxx11::string::~string((string *)&local_330);
          std::__cxx11::string::~string((string *)&local_390);
          tcu::LogImageSet::~LogImageSet(&local_3d0);
          std::__cxx11::string::~string((string *)&testColor);
          std::__cxx11::string::~string((string *)&refcolor);
          colDiff.m_data._0_8_ =
               ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)(colDiff.m_data + 2));
          std::operator<<((ostream *)(colDiff.m_data + 2),"Image compare failed.");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&colDiff,(EndMessageToken *)&tcu::TestLog::EndMessage);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(colDiff.m_data + 2));
        tcu::Surface::~Surface(&errorMask);
      }
      else {
        pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        tcu::Surface::getAccess((PixelBufferAccess *)&colDiff,this->m_refResult);
        tcu::Surface::getAccess((PixelBufferAccess *)&local_240,this->m_glResult);
        bVar5 = tcu::fuzzyCompare(pTVar2,"Compare Results","Compare Results",
                                  (ConstPixelBufferAccess *)&colDiff,
                                  (ConstPixelBufferAccess *)&local_240,0.02,COMPARE_LOG_RESULT);
      }
      if (bVar5) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_PASS,"Pass");
        return STOP;
      }
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Image comparison failed");
      return STOP;
    }
    pRVar8 = Context::getRenderTarget((this->super_TestCase).m_context);
    iVar12 = pRVar8->m_width;
    pRVar8 = Context::getRenderTarget((this->super_TestCase).m_context);
    if ((iVar12 < (this->m_viewportSize).m_data[0]) ||
       (pRVar8->m_height < (this->m_viewportSize).m_data[1])) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3d0,"Render target size must be at least ",
                 (allocator<char> *)&local_390);
      de::toString<int>((string *)&refcolor,(this->m_viewportSize).m_data);
      std::operator+(&local_2d0.m_name,&local_3d0.m_name,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&refcolor)
      ;
      std::operator+(&local_240.m_name,&local_2d0.m_name,"x");
      de::toString<int>((string *)&testColor,(this->m_viewportSize).m_data + 1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&colDiff,
                     &local_240.m_name,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&testColor
                    );
      tcu::NotSupportedError::NotSupportedError(this_00,(string *)&colDiff);
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])(this);
  }
  return CONTINUE;
}

Assistant:

tcu::TestCase::IterateResult GeometryShaderRenderTest::iterate (void)
{
	// init() must be called
	DE_ASSERT(m_glContext);
	DE_ASSERT(m_refContext);

	const int iteration = m_interationCount++;

	if (iteration == 0)
	{
		// Check requirements
		const int width	 = m_context.getRenderTarget().getWidth();
		const int height = m_context.getRenderTarget().getHeight();

		if (width < m_viewportSize.x() || height < m_viewportSize.y())
			throw tcu::NotSupportedError(std::string("Render target size must be at least ") + de::toString(m_viewportSize.x()) + "x" + de::toString(m_viewportSize.y()));

		// Gen data
		genVertexAttribData();

		return CONTINUE;
	}
	else if (iteration == 1)
	{
		// Render
		sglr::ShaderProgram& program = getProgram();

		renderWithContext(*m_glContext, program, *m_glResult);
		renderWithContext(*m_refContext, program, *m_refResult);

		return CONTINUE;
	}
	else
	{
		if (compare())
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");

		return STOP;
	}
}